

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O2

parser_error parse_player_timed_effect_dice(parser *p)

{
  _Bool _Var1;
  void *pvVar2;
  dice_t *dice;
  char *string;
  parser_error pVar3;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    if (*(long *)((long)pvVar2 + 8) == 0) {
      pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      dice = dice_new();
      pVar3 = PARSE_ERROR_INVALID_DICE;
      if (dice != (dice_t *)0x0) {
        string = parser_getstr(p,"dice");
        _Var1 = dice_parse_string(dice,string);
        if (_Var1) {
          dice_free(*(dice_t **)(*(long *)((long)pvVar2 + 8) + 0x10));
          *(dice_t **)(*(long *)((long)pvVar2 + 8) + 0x10) = dice;
          pVar3 = PARSE_ERROR_NONE;
        }
        else {
          dice_free(dice);
        }
      }
    }
    return pVar3;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,0x1ee,"enum parser_error parse_player_timed_effect_dice(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_effect_dice(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	dice_t *dice;
	const char *string;

	assert(ps);
	if (!ps->e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	dice = dice_new();
	if (dice == NULL) {
		return PARSE_ERROR_INVALID_DICE;
	}
	string = parser_getstr(p, "dice");
	if (dice_parse_string(dice, string)) {
		dice_free(ps->e->dice);
		ps->e->dice = dice;
	} else {
		dice_free(dice);
		return PARSE_ERROR_INVALID_DICE;
	}
	return PARSE_ERROR_NONE;
}